

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

string * __thiscall
test_flash_attn_ext::vars_abi_cxx11_(string *__return_storage_ptr__,test_flash_attn_ext *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  char *pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  ulong *local_5d0;
  long local_5c8;
  ulong local_5c0;
  long lStack_5b8;
  ulong *local_5b0;
  long local_5a8;
  ulong local_5a0;
  long lStack_598;
  ulong *local_590;
  long local_588;
  ulong local_580;
  long lStack_578;
  ulong *local_570;
  long local_568;
  ulong local_560;
  long lStack_558;
  ulong *local_550;
  long local_548;
  ulong local_540;
  long lStack_538;
  ulong *local_530;
  long local_528;
  ulong local_520;
  long lStack_518;
  ulong *local_510;
  long local_508;
  ulong local_500;
  long lStack_4f8;
  ulong *local_4f0;
  long local_4e8;
  ulong local_4e0;
  long lStack_4d8;
  ulong *local_4d0;
  long local_4c8;
  ulong local_4c0;
  long lStack_4b8;
  ulong *local_4b0;
  long local_4a8;
  ulong local_4a0;
  long lStack_498;
  ulong *local_490;
  long local_488;
  ulong local_480;
  long lStack_478;
  ulong *local_470;
  long local_468;
  ulong local_460;
  long lStack_458;
  ulong *local_450;
  long local_448;
  ulong local_440;
  long lStack_438;
  ulong *local_430;
  long local_428;
  ulong local_420;
  long lStack_418;
  ulong *local_410;
  long local_408;
  ulong local_400;
  long lStack_3f8;
  ulong *local_3f0;
  long local_3e8;
  ulong local_3e0;
  long lStack_3d8;
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  ulong *local_3b0;
  long local_3a8;
  ulong local_3a0;
  long lStack_398;
  long *local_390;
  undefined8 local_388;
  long local_380;
  undefined8 uStack_378;
  long *local_370;
  undefined8 local_368;
  long local_360;
  undefined8 uStack_358;
  long *local_350;
  undefined8 local_348;
  long local_340;
  undefined8 uStack_338;
  long *local_330;
  undefined8 local_328;
  long local_320;
  undefined8 uStack_318;
  long *local_310;
  undefined8 local_308;
  long local_300;
  undefined8 uStack_2f8;
  long *local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  undefined8 uStack_2d8;
  long *local_2d0;
  undefined8 local_2c8;
  long local_2c0;
  undefined8 uStack_2b8;
  long *local_2b0;
  undefined8 local_2a8;
  long local_2a0;
  undefined8 uStack_298;
  long *local_290;
  undefined8 local_288;
  long local_280;
  undefined8 uStack_278;
  long *local_270;
  undefined8 local_268;
  long local_260;
  undefined8 uStack_258;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0 [2];
  long local_1a0 [2];
  string local_190;
  long *local_170 [2];
  long local_160 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  var_to_str<long>(&local_50,(long *)this->hsk);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1590d1);
  local_1d0 = &local_1c0;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_1c0 = *plVar6;
    lStack_1b8 = plVar4[3];
  }
  else {
    local_1c0 = *plVar6;
    local_1d0 = (long *)*plVar4;
  }
  local_1c8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_4c0 = *puVar7;
    lStack_4b8 = plVar4[3];
    local_4d0 = &local_4c0;
  }
  else {
    local_4c0 = *puVar7;
    local_4d0 = (ulong *)*plVar4;
  }
  local_4c8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<long>(&local_70,(long *)this->hsv);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1590d6);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_4e0 = *puVar7;
    lStack_4d8 = plVar4[3];
    local_4f0 = &local_4e0;
  }
  else {
    local_4e0 = *puVar7;
    local_4f0 = (ulong *)*plVar4;
  }
  local_4e8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_4d0 != &local_4c0) {
    uVar9 = local_4c0;
  }
  if (uVar9 < (ulong)(local_4e8 + local_4c8)) {
    uVar9 = 0xf;
    if (local_4f0 != &local_4e0) {
      uVar9 = local_4e0;
    }
    if (uVar9 < (ulong)(local_4e8 + local_4c8)) goto LAB_00145fd5;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4f0,0,(char *)0x0,(ulong)local_4d0);
  }
  else {
LAB_00145fd5:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_4f0);
  }
  local_390 = &local_380;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_380 = *plVar4;
    uStack_378 = puVar5[3];
  }
  else {
    local_380 = *plVar4;
    local_390 = (long *)*puVar5;
  }
  local_388 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_390);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_4a0 = *puVar7;
    lStack_498 = plVar4[3];
    local_4b0 = &local_4a0;
  }
  else {
    local_4a0 = *puVar7;
    local_4b0 = (ulong *)*plVar4;
  }
  local_4a8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<long>(&local_90,(long *)this->nh);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1590db);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_500 = *puVar7;
    lStack_4f8 = plVar4[3];
    local_510 = &local_500;
  }
  else {
    local_500 = *puVar7;
    local_510 = (ulong *)*plVar4;
  }
  local_508 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_4b0 != &local_4a0) {
    uVar9 = local_4a0;
  }
  if (uVar9 < (ulong)(local_508 + local_4a8)) {
    uVar9 = 0xf;
    if (local_510 != &local_500) {
      uVar9 = local_500;
    }
    if (uVar9 < (ulong)(local_508 + local_4a8)) goto LAB_00146180;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_510,0,(char *)0x0,(ulong)local_4b0);
  }
  else {
LAB_00146180:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4b0,(ulong)local_510);
  }
  local_370 = &local_360;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_360 = *plVar4;
    uStack_358 = puVar5[3];
  }
  else {
    local_360 = *plVar4;
    local_370 = (long *)*puVar5;
  }
  local_368 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_370);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_480 = *puVar7;
    lStack_478 = plVar4[3];
    local_490 = &local_480;
  }
  else {
    local_480 = *puVar7;
    local_490 = (ulong *)*plVar4;
  }
  local_488 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<long>(&local_b0,(long *)this->nr);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x158d65);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_520 = *puVar7;
    lStack_518 = plVar4[3];
    local_530 = &local_520;
  }
  else {
    local_520 = *puVar7;
    local_530 = (ulong *)*plVar4;
  }
  local_528 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_490 != &local_480) {
    uVar9 = local_480;
  }
  if (uVar9 < (ulong)(local_528 + local_488)) {
    uVar9 = 0xf;
    if (local_530 != &local_520) {
      uVar9 = local_520;
    }
    if (uVar9 < (ulong)(local_528 + local_488)) goto LAB_0014632b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_530,0,(char *)0x0,(ulong)local_490);
  }
  else {
LAB_0014632b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_490,(ulong)local_530);
  }
  local_350 = &local_340;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_340 = *plVar4;
    uStack_338 = puVar5[3];
  }
  else {
    local_340 = *plVar4;
    local_350 = (long *)*puVar5;
  }
  local_348 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_350);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_460 = *puVar7;
    lStack_458 = plVar4[3];
    local_470 = &local_460;
  }
  else {
    local_460 = *puVar7;
    local_470 = (ulong *)*plVar4;
  }
  local_468 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<long>(&local_d0,(long *)this->kv);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x1590df);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_540 = *puVar7;
    lStack_538 = plVar4[3];
    local_550 = &local_540;
  }
  else {
    local_540 = *puVar7;
    local_550 = (ulong *)*plVar4;
  }
  local_548 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_470 != &local_460) {
    uVar9 = local_460;
  }
  if (uVar9 < (ulong)(local_548 + local_468)) {
    uVar9 = 0xf;
    if (local_550 != &local_540) {
      uVar9 = local_540;
    }
    if (uVar9 < (ulong)(local_548 + local_468)) goto LAB_001464d6;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_550,0,(char *)0x0,(ulong)local_470);
  }
  else {
LAB_001464d6:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_470,(ulong)local_550);
  }
  local_330 = &local_320;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_320 = *plVar4;
    uStack_318 = puVar5[3];
  }
  else {
    local_320 = *plVar4;
    local_330 = (long *)*puVar5;
  }
  local_328 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_330);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_440 = *puVar7;
    lStack_438 = plVar4[3];
    local_450 = &local_440;
  }
  else {
    local_440 = *puVar7;
    local_450 = (ulong *)*plVar4;
  }
  local_448 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<long>(&local_f0,(long *)this->nb);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1590e3);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_560 = *puVar7;
    lStack_558 = plVar4[3];
    local_570 = &local_560;
  }
  else {
    local_560 = *puVar7;
    local_570 = (ulong *)*plVar4;
  }
  local_568 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_450 != &local_440) {
    uVar9 = local_440;
  }
  if (uVar9 < (ulong)(local_568 + local_448)) {
    uVar9 = 0xf;
    if (local_570 != &local_560) {
      uVar9 = local_560;
    }
    if (uVar9 < (ulong)(local_568 + local_448)) goto LAB_0014666c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_570,0,(char *)0x0,(ulong)local_450);
  }
  else {
LAB_0014666c:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_570);
  }
  local_310 = &local_300;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_300 = *plVar4;
    uStack_2f8 = puVar5[3];
  }
  else {
    local_300 = *plVar4;
    local_310 = (long *)*puVar5;
  }
  local_308 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_310);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_420 = *puVar7;
    lStack_418 = plVar4[3];
    local_430 = &local_420;
  }
  else {
    local_420 = *puVar7;
    local_430 = (ulong *)*plVar4;
  }
  local_428 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<bool>(&local_110,(bool *)(ulong)*(uint *)&this->mask);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x158fcb);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_580 = *puVar7;
    lStack_578 = plVar4[3];
    local_590 = &local_580;
  }
  else {
    local_580 = *puVar7;
    local_590 = (ulong *)*plVar4;
  }
  local_588 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_430 != &local_420) {
    uVar9 = local_420;
  }
  if (uVar9 < (ulong)(local_588 + local_428)) {
    uVar9 = 0xf;
    if (local_590 != &local_580) {
      uVar9 = local_580;
    }
    if (uVar9 < (ulong)(local_588 + local_428)) goto LAB_001467ff;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_590,0,(char *)0x0,(ulong)local_430);
  }
  else {
LAB_001467ff:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_590);
  }
  local_2f0 = &local_2e0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_2e0 = *plVar4;
    uStack_2d8 = puVar5[3];
  }
  else {
    local_2e0 = *plVar4;
    local_2f0 = (long *)*puVar5;
  }
  local_2e8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_400 = *puVar7;
    lStack_3f8 = plVar4[3];
    local_410 = &local_400;
  }
  else {
    local_400 = *puVar7;
    local_410 = (ulong *)*plVar4;
  }
  local_408 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_130,vsnprintf,0x3a,"%f",SUB84((double)this->max_bias,0));
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x158fd9);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_5a0 = *puVar7;
    lStack_598 = plVar4[3];
    local_5b0 = &local_5a0;
  }
  else {
    local_5a0 = *puVar7;
    local_5b0 = (ulong *)*plVar4;
  }
  local_5a8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_410 != &local_400) {
    uVar9 = local_400;
  }
  if (uVar9 < (ulong)(local_5a8 + local_408)) {
    uVar9 = 0xf;
    if (local_5b0 != &local_5a0) {
      uVar9 = local_5a0;
    }
    if (uVar9 < (ulong)(local_5a8 + local_408)) goto LAB_001469ac;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5b0,0,(char *)0x0,(ulong)local_410);
  }
  else {
LAB_001469ac:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_5b0);
  }
  local_2d0 = &local_2c0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_2c0 = *plVar4;
    uStack_2b8 = puVar5[3];
  }
  else {
    local_2c0 = *plVar4;
    local_2d0 = (long *)*puVar5;
  }
  local_2c8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_3e0 = *puVar7;
    lStack_3d8 = plVar4[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *puVar7;
    local_3f0 = (ulong *)*plVar4;
  }
  local_3e8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_150,vsnprintf,0x3a,"%f",SUB84((double)this->logit_softcap,0));
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x1590e7);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_5c0 = *puVar7;
    lStack_5b8 = plVar4[3];
    local_5d0 = &local_5c0;
  }
  else {
    local_5c0 = *puVar7;
    local_5d0 = (ulong *)*plVar4;
  }
  local_5c8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_3f0 != &local_3e0) {
    uVar9 = local_3e0;
  }
  if (uVar9 < (ulong)(local_5c8 + local_3e8)) {
    uVar9 = 0xf;
    if (local_5d0 != &local_5c0) {
      uVar9 = local_5c0;
    }
    if (uVar9 < (ulong)(local_5c8 + local_3e8)) goto LAB_00146b59;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5d0,0,(char *)0x0,(ulong)local_3f0);
  }
  else {
LAB_00146b59:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3f0,(ulong)local_5d0);
  }
  local_2b0 = &local_2a0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_2a0 = *plVar4;
    uStack_298 = puVar5[3];
  }
  else {
    local_2a0 = *plVar4;
    local_2b0 = (long *)*puVar5;
  }
  local_2a8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_200 = *puVar7;
    uStack_1f8 = (undefined4)plVar4[3];
    uStack_1f4 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar7;
    local_210 = (ulong *)*plVar4;
  }
  local_208 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  bVar10 = this->prec == GGML_PREC_F32;
  pcVar8 = "def";
  if (bVar10) {
    pcVar8 = "f32";
  }
  local_1b0[0] = local_1a0;
  pcVar3 = "def";
  if (bVar10) {
    pcVar3 = "f32";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,pcVar8,pcVar3 + 3);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,0x158fd3);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_220 = *puVar7;
    lStack_218 = plVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar7;
    local_230 = (ulong *)*plVar4;
  }
  local_228 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_210 != &local_200) {
    uVar9 = local_200;
  }
  if (uVar9 < (ulong)(local_228 + local_208)) {
    uVar9 = 0xf;
    if (local_230 != &local_220) {
      uVar9 = local_220;
    }
    if (uVar9 < (ulong)(local_228 + local_208)) goto LAB_00146d35;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_210);
  }
  else {
LAB_00146d35:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_230);
  }
  local_290 = &local_280;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_280 = *plVar4;
    uStack_278 = puVar5[3];
  }
  else {
    local_280 = *plVar4;
    local_290 = (long *)*puVar5;
  }
  local_288 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_290);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_3c0 = *puVar7;
    uStack_3b8 = (undefined4)plVar4[3];
    uStack_3b4 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_3d0 = &local_3c0;
  }
  else {
    local_3c0 = *puVar7;
    local_3d0 = (ulong *)*plVar4;
  }
  local_3c8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pcVar8 = (char *)ggml_type_name(this->type_KV);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_170,pcVar8,(allocator<char> *)&local_3b0);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_170,0,(char *)0x0,0x1590f6);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_240 = *puVar7;
    lStack_238 = plVar4[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar7;
    local_250 = (ulong *)*plVar4;
  }
  local_248 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_3d0 != &local_3c0) {
    uVar9 = local_3c0;
  }
  if (uVar9 < (ulong)(local_248 + local_3c8)) {
    uVar9 = 0xf;
    if (local_250 != &local_240) {
      uVar9 = local_240;
    }
    if (uVar9 < (ulong)(local_248 + local_3c8)) goto LAB_00146ef0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_3d0);
  }
  else {
LAB_00146ef0:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_250);
  }
  local_270 = &local_260;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_260 = *plVar4;
    uStack_258 = puVar5[3];
  }
  else {
    local_260 = *plVar4;
    local_270 = (long *)*puVar5;
  }
  local_268 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_270);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_1e0 = *puVar7;
    lStack_1d8 = plVar4[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar7;
    local_1f0 = (ulong *)*plVar4;
  }
  local_1e8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<int,4ul>(&local_190,&this->permute);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x158e24);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_3a0 = *puVar7;
    lStack_398 = plVar4[3];
    local_3b0 = &local_3a0;
  }
  else {
    local_3a0 = *puVar7;
    local_3b0 = (ulong *)*plVar4;
  }
  local_3a8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar9 = 0xf;
  if (local_1f0 != &local_1e0) {
    uVar9 = local_1e0;
  }
  if (uVar9 < (ulong)(local_3a8 + local_1e8)) {
    uVar9 = 0xf;
    if (local_3b0 != &local_3a0) {
      uVar9 = local_3a0;
    }
    if ((ulong)(local_3a8 + local_1e8) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)local_1f0);
      goto LAB_001470be;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_3b0);
LAB_001470be:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar2 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0,local_3a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_170[0] != local_160) {
    operator_delete(local_170[0],local_160[0] + 1);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0,local_3c0 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0,local_5c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if (local_5b0 != &local_5a0) {
    operator_delete(local_5b0,local_5a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410,local_400 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_590 != &local_580) {
    operator_delete(local_590,local_580 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430,local_420 + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_570 != &local_560) {
    operator_delete(local_570,local_560 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450,local_440 + 1);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330,local_320 + 1);
  }
  if (local_550 != &local_540) {
    operator_delete(local_550,local_540 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350,local_340 + 1);
  }
  if (local_530 != &local_520) {
    operator_delete(local_530,local_520 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_490 != &local_480) {
    operator_delete(local_490,local_480 + 1);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (local_510 != &local_500) {
    operator_delete(local_510,local_500 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_4b0 != &local_4a0) {
    operator_delete(local_4b0,local_4a0 + 1);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390,local_380 + 1);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,local_4e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,local_4c0 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR12(hsk, hsv, nh, nr, kv, nb, mask, max_bias, logit_softcap, prec, type_KV, permute);
    }